

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflags.h
# Opt level: O1

void __thiscall
QRhiGles2::trackedBufferBarrier
          (QRhiGles2 *this,QGles2CommandBuffer *cbD,QGles2Buffer *bufD,Access access)

{
  Access AVar1;
  int iVar2;
  int iVar3;
  Command *pCVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  Command *__dest;
  
  if ((((bufD->super_QRhiBuffer).m_usage.super_QFlagsStorageHelper<QRhiBuffer::UsageFlag,_4>.
        super_QFlagsStorage<QRhiBuffer::UsageFlag>.i & 8) != 0) &&
     (AVar1 = (bufD->usageState).access, AVar1 != access)) {
    if (AVar1 - AccessStorageWrite < 3) {
      iVar2 = (cbD->commands).p;
      iVar3 = (cbD->commands).a;
      if (iVar2 == iVar3) {
        uVar6 = (long)iVar3 + 0x400;
        (cbD->commands).a = (int)uVar6;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar6;
        uVar6 = 0xffffffffffffffff;
        if (SUB168(auVar5 * ZEXT816(0x68),8) == 0) {
          uVar6 = SUB168(auVar5 * ZEXT816(0x68),0);
        }
        __dest = (Command *)operator_new__(uVar6);
        pCVar4 = (cbD->commands).v;
        if (pCVar4 != (Command *)0x0) {
          memcpy(__dest,pCVar4,(long)iVar2 * 0x68);
          operator_delete__(pCVar4);
        }
        (cbD->commands).v = __dest;
      }
      pCVar4 = (cbD->commands).v;
      iVar2 = (cbD->commands).p;
      (cbD->commands).p = iVar2 + 1;
      pCVar4[iVar2].cmd = Barrier;
      pCVar4[iVar2].args.viewport.x = 1.22067e-41;
    }
    (bufD->usageState).access = access;
  }
  return;
}

Assistant:

constexpr inline bool testFlags(QFlags flags) const noexcept { return flags.i ? ((i & flags.i) == flags.i) : i == Int(0); }